

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

TcParseTableBase * __thiscall google::protobuf::MessageLite::GetTcParseTable(MessageLite *this)

{
  TcParseTableBase *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TcParseTableBase *local_18;
  
  iVar2 = (*this->_vptr_MessageLite[4])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    GetTcParseTable();
  }
  else {
    pTVar1 = *(TcParseTableBase **)(CONCAT44(extraout_var,iVar2) + 8);
    if (pTVar1 != (TcParseTableBase *)0x0) {
      return pTVar1;
    }
  }
  GetTcParseTable();
  return local_18;
}

Assistant:

const internal::TcParseTableBase* GetTcParseTable() const {
    auto* data = GetClassData();
    ABSL_DCHECK(data != nullptr);

    auto* tc_table = data->tc_table;
    if (ABSL_PREDICT_FALSE(tc_table == nullptr)) {
      ABSL_DCHECK(!data->is_lite);
      return data->full().descriptor_methods->get_tc_table(*this);
    }
    return tc_table;
  }